

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O3

void learn(nn_quant *nnq,int verbose)

{
  nq_pixel *paiVar1;
  nq_pixel *paiVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [13];
  uint5 uVar6;
  undefined1 auVar7 [13];
  uint uVar8;
  int i;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint *puVar19;
  int al;
  double dVar20;
  int r;
  int b;
  int g;
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint local_8c;
  ulong local_80;
  ulong local_68;
  int iVar22;
  int iVar23;
  
  nnq->alphadec = (nnq->samplefac + -1) / 3 + 0x1e;
  puVar13 = (uint *)nnq->thepicture;
  iVar11 = nnq->lengthcount;
  lVar18 = (long)iVar11;
  uVar3 = iVar11 / (nnq->samplefac << 2);
  nnq->radpower[0] = 0x40000;
  nnq->radpower[1] = 0x3fc00;
  nnq->radpower[2] = 0x3fc00;
  nnq->radpower[3] = 0x3f400;
  nnq->radpower[4] = 0x3f000;
  nnq->radpower[5] = 0x3e400;
  nnq->radpower[6] = 0x3dc00;
  nnq->radpower[7] = 0x3cc00;
  nnq->radpower[8] = 0x3c000;
  nnq->radpower[9] = 0x3ac00;
  nnq->radpower[10] = 0x39c00;
  nnq->radpower[0xb] = 0x38400;
  nnq->radpower[0xc] = 0x37000;
  nnq->radpower[0xd] = 0x35400;
  nnq->radpower[0xe] = 0x33c00;
  nnq->radpower[0xf] = 0x31c00;
  nnq->radpower[0x10] = 0x30000;
  nnq->radpower[0x11] = 0x2dc00;
  nnq->radpower[0x12] = 0x2bc00;
  nnq->radpower[0x13] = 0x29400;
  nnq->radpower[0x14] = 0x27000;
  nnq->radpower[0x15] = 0x24400;
  nnq->radpower[0x16] = 0x21c00;
  nnq->radpower[0x17] = 0x1ec00;
  nnq->radpower[0x18] = 0x1c000;
  nnq->radpower[0x19] = 0x18c00;
  nnq->radpower[0x1a] = 0x15c00;
  nnq->radpower[0x1b] = 0x12400;
  nnq->radpower[0x1c] = 0xf000;
  nnq->radpower[0x1d] = 0xb400;
  nnq->radpower[0x1e] = 0x7c00;
  nnq->radpower[0x1f] = 0x3c00;
  uVar8 = 1;
  if (0xc6 < uVar3 + 99) {
    uVar8 = (int)uVar3 / 100;
  }
  if (verbose != 0) {
    gd_error_ex(5,"beginning 1D learning: initial radius=%d\n",0x20);
    iVar11 = nnq->lengthcount;
  }
  uVar12 = 0x7cc;
  local_80 = 0x7cc;
  if (iVar11 * -0x412780c5 + 0x41aad6U < 0x8355ad) {
    uVar12 = 0x7ac;
    local_80 = 0x7ac;
    if (iVar11 * -0x16f0e13d + 0x42bcbdU < 0x85797b) {
      local_80 = (ulong)(iVar11 * -0x46707e29 + 0x434911U < 0x869223) << 6 | 0x79c;
    }
  }
  if ((int)uVar3 < 1) {
    dVar20 = 1.0;
  }
  else {
    puVar19 = (uint *)(lVar18 + (long)puVar13);
    local_68 = 0x800;
    local_8c = 0x20;
    uVar15 = 0x400;
    uVar17 = 0;
    do {
      uVar16 = *puVar13;
      auVar5[0xc] = (char)(uVar16 >> 0x18);
      auVar5._0_12_ = ZEXT712(0);
      uVar6 = CONCAT32(auVar5._10_3_,(ushort)(byte)(uVar16 >> 0x10));
      auVar7._5_8_ = 0;
      auVar7._0_5_ = uVar6;
      al = (uVar16 & 0xff) * 0x10;
      iVar22 = (int)CONCAT72(SUB137(auVar7 << 0x40,6),(ushort)(byte)(uVar16 >> 8));
      r = iVar22 * 0x10;
      iVar23 = (int)uVar6;
      uVar4 = (uint)(uint3)(auVar5._10_3_ >> 0x10);
      b = iVar23 * 0x10;
      g = uVar4 * 0x10;
      i = contest(nnq,al,b,g,r);
      paiVar1 = nnq->network + i;
      iVar11 = (*paiVar1)[1];
      iVar10 = (*paiVar1)[2];
      iVar9 = (*paiVar1)[3];
      auVar24._0_4_ = (*paiVar1)[0] + (uVar16 & 0xff) * -0x10;
      auVar24._4_4_ = iVar11 + iVar23 * -0x10;
      auVar24._8_4_ = iVar10 + uVar4 * -0x10;
      auVar24._12_4_ = iVar9 + iVar22 * -0x10;
      auVar26._4_4_ = auVar24._4_4_;
      auVar26._0_4_ = auVar24._4_4_;
      auVar26._8_4_ = auVar24._12_4_;
      auVar26._12_4_ = auVar24._12_4_;
      iVar22 = (int)((auVar24._8_8_ & 0xffffffff) * (ulong)uVar15);
      iVar23 = (int)((auVar26._8_8_ & 0xffffffff) * (ulong)uVar15);
      paiVar2 = nnq->network + i;
      (*paiVar2)[0] =
           (*paiVar1)[0] -
           ((int)(((uint)((int)(auVar24._0_4_ * uVar15) >> 0x1f) >> 0x16) + auVar24._0_4_ * uVar15)
           >> 10);
      (*paiVar2)[1] =
           iVar11 - ((int)(((uint)((int)(auVar24._4_4_ * uVar15) >> 0x1f) >> 0x16) +
                          auVar24._4_4_ * uVar15) >> 10);
      (*paiVar2)[2] = iVar10 - ((int)(((uint)(iVar22 >> 0x1f) >> 0x16) + iVar22) >> 10);
      (*paiVar2)[3] = iVar9 - ((int)(((uint)(iVar23 >> 0x1f) >> 0x16) + iVar23) >> 10);
      if (local_8c != 0) {
        alterneigh(nnq,local_8c,i,al,b,g,r);
      }
      auVar24 = _DAT_00123050;
      puVar13 = (uint *)((long)puVar13 + local_80);
      if (puVar19 <= puVar13) {
        do {
          puVar13 = (uint *)((long)puVar13 - (long)nnq->lengthcount);
        } while (puVar19 <= puVar13);
      }
      uVar16 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar16;
      uVar12 = uVar17 % (ulong)uVar8;
      if ((int)(uVar17 % (ulong)uVar8) == 0) {
        uVar15 = uVar15 - (int)uVar15 / nnq->alphadec;
        iVar11 = (int)((ulong)((long)(int)local_68 * 0x77777777) >> 0x20) - (int)local_68;
        local_8c = ((iVar11 >> 4) - (iVar11 >> 0x1f)) + (int)local_68;
        local_68 = (ulong)local_8c;
        local_8c = (int)local_8c >> 6;
        uVar12 = local_68;
        if ((int)local_8c < 2) {
          local_8c = 0;
        }
        else {
          iVar11 = local_8c * local_8c;
          lVar18 = (ulong)local_8c - 1;
          auVar21._8_4_ = (int)lVar18;
          auVar21._0_8_ = lVar18;
          auVar21._12_4_ = (int)((ulong)lVar18 >> 0x20);
          auVar21 = auVar21 ^ _DAT_00123050;
          uVar14 = 0;
          auVar25 = _DAT_00123040;
          do {
            auVar26 = auVar25 ^ auVar24;
            iVar10 = (int)uVar14;
            if ((bool)(~(auVar21._4_4_ < auVar26._4_4_ ||
                        auVar21._0_4_ < auVar26._0_4_ && auVar26._4_4_ == auVar21._4_4_) & 1)) {
              iVar9 = (iVar11 - iVar10 * iVar10) * 0x100;
              uVar12 = (long)iVar9 % (long)iVar11 & 0xffffffff;
              nnq->radpower[uVar14] = (iVar9 / iVar11) * uVar15;
            }
            if (auVar26._12_4_ <= auVar21._12_4_ &&
                (auVar26._8_4_ <= auVar21._8_4_ || auVar26._12_4_ != auVar21._12_4_)) {
              iVar10 = (iVar11 - (iVar10 + 1) * (iVar10 + 1)) * 0x100;
              uVar12 = (long)iVar10 % (long)iVar11 & 0xffffffff;
              nnq->radpower[uVar14 + 1] = (iVar10 / iVar11) * uVar15;
            }
            uVar14 = uVar14 + 2;
            lVar18 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 2;
            auVar25._8_8_ = lVar18 + 2;
          } while ((local_8c + 1 & 0xfffffffe) != uVar14);
        }
      }
    } while (uVar16 != uVar3);
    dVar20 = (double)((float)(int)uVar15 * 0.0009765625);
  }
  if (verbose != 0) {
    gd_error_ex(5,"finished 1D learning: final alpha=%f !\n",dVar20,uVar12);
    return;
  }
  return;
}

Assistant:

void learn(nnq, verbose) /* Stu: N.B. added parameter so that main() could control verbosity. */
nn_quant *nnq;
int verbose;
{
	register int i,j,al,b,g,r;
	int radius,rad,alpha,step,delta,samplepixels;
	register unsigned char *p;
	unsigned char *lim;

	nnq->alphadec = 30 + ((nnq->samplefac-1)/3);
	p = nnq->thepicture;
	lim = nnq->thepicture + nnq->lengthcount;
	samplepixels = nnq->lengthcount/(4 * nnq->samplefac);
	/* here's a problem with small images: samplepixels < ncycles => delta = 0 */
	delta = samplepixels/ncycles;
	/* kludge to fix */
	if(delta==0) delta = 1;
	alpha = initalpha;
	radius = initradius;

	rad = radius >> radiusbiasshift;

	for (i=0; i<rad; i++)
		nnq->radpower[i] = alpha*(((rad*rad - i*i)*radbias)/(rad*rad));

	if (verbose) gd_error_ex(GD_NOTICE, "beginning 1D learning: initial radius=%d\n", rad);

	if ((nnq->lengthcount%prime1) != 0) step = 4*prime1;
	else {
		if ((nnq->lengthcount%prime2) !=0) step = 4*prime2;
		else {
			if ((nnq->lengthcount%prime3) !=0) step = 4*prime3;
			else step = 4*prime4;
		}
	}

	i = 0;
	while (i < samplepixels) {
		al = p[ALPHA] << netbiasshift;
		b = p[BLUE] << netbiasshift;
		g = p[GREEN] << netbiasshift;
		r = p[RED] << netbiasshift;
		j = contest(nnq, al,b,g,r);

		altersingle(nnq, alpha,j,al,b,g,r);
		if (rad) alterneigh(nnq, rad,j,al,b,g,r);   /* alter neighbours */

		p += step;
		while (p >= lim) p -= nnq->lengthcount;

		i++;
		if (i%delta == 0) {                    /* FPE here if delta=0*/
			alpha -= alpha / nnq->alphadec;
			radius -= radius / radiusdec;
			rad = radius >> radiusbiasshift;
			if (rad <= 1) rad = 0;
			for (j=0; j<rad; j++)
				nnq->radpower[j] = alpha*(((rad*rad - j*j)*radbias)/(rad*rad));
		}
	}
	if (verbose) gd_error_ex(GD_NOTICE, "finished 1D learning: final alpha=%f !\n",((float)alpha)/initalpha);
}